

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# magic_enum_fuse.hpp
# Opt level: O0

optional<enum_fuse_t> __thiscall
magic_enum::enum_fuse<Color,Directions,Index>
          (magic_enum *this,Color values,Directions values_1,Index values_2)

{
  bool bVar1;
  undefined8 extraout_RDX;
  optional<enum_fuse_t> oVar2;
  _Storage<enum_fuse_t,_true> _Stack_38;
  optional<enum_fuse_t> fuse;
  Index values_local_2;
  Directions values_local_1;
  Color values_local;
  
  fuse.super__Optional_base<enum_fuse_t,_true,_true>._M_payload.
  super__Optional_payload_base<enum_fuse_t>._12_4_ = values_1;
  oVar2 = detail::typesafe_fuse_enum<Color,Directions,Index>
                    ((detail *)((ulong)this & 0xffffffff),values,values_1,values_2);
  _Stack_38._M_value =
       oVar2.super__Optional_base<enum_fuse_t,_true,_true>._M_payload.
       super__Optional_payload_base<enum_fuse_t>._M_payload;
  fuse.super__Optional_base<enum_fuse_t,_true,_true>._M_payload.
  super__Optional_payload_base<enum_fuse_t>._M_payload._M_value._0_1_ =
       oVar2.super__Optional_base<enum_fuse_t,_true,_true>._M_payload.
       super__Optional_payload_base<enum_fuse_t>._M_engaged;
  bVar1 = std::optional::operator_cast_to_bool((optional *)&_Stack_38);
  if (!bVar1) {
    __assert_fail("(fuse)",
                  "/workspace/llm4binary/github/license_c_cmakelists/Neargye[P]magic_enum/include/magic_enum/magic_enum_fuse.hpp"
                  ,0x54,"auto magic_enum::enum_fuse(Es...) [Es = <Color, Directions, Index>]");
  }
  oVar2.super__Optional_base<enum_fuse_t,_true,_true>._M_payload.
  super__Optional_payload_base<enum_fuse_t>._9_7_ = (undefined7)((ulong)extraout_RDX >> 8);
  oVar2.super__Optional_base<enum_fuse_t,_true,_true>._M_payload.
  super__Optional_payload_base<enum_fuse_t>._M_engaged =
       (bool)fuse.super__Optional_base<enum_fuse_t,_true,_true>._M_payload.
             super__Optional_payload_base<enum_fuse_t>._M_payload._M_value._0_1_;
  oVar2.super__Optional_base<enum_fuse_t,_true,_true>._M_payload.
  super__Optional_payload_base<enum_fuse_t>._M_payload._M_value = _Stack_38._M_value;
  return (optional<enum_fuse_t>)
         oVar2.super__Optional_base<enum_fuse_t,_true,_true>._M_payload.
         super__Optional_payload_base<enum_fuse_t>;
}

Assistant:

[[nodiscard]] constexpr auto enum_fuse(Es... values) noexcept {
  static_assert((std::is_enum_v<std::decay_t<Es>> && ...), "magic_enum::enum_fuse requires enum type.");
  static_assert(sizeof...(Es) >= 2, "magic_enum::enum_fuse requires at least 2 values.");
  static_assert((detail::log2(enum_count<std::decay_t<Es>>() + 1) + ...) <= (sizeof(std::uintmax_t) * 8), "magic_enum::enum_fuse does not work for large enums");
#if defined(MAGIC_ENUM_NO_TYPESAFE_ENUM_FUSE)
  const auto fuse = detail::fuse_enum<std::decay_t<Es>...>(values...);
#else
  const auto fuse = detail::typesafe_fuse_enum<std::decay_t<Es>...>(values...);
#endif
  return MAGIC_ENUM_ASSERT(fuse), fuse;
}